

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbgtool.c
# Opt level: O1

void bt1(FX *startFX)

{
  int iVar1;
  DLword DVar2;
  DLword *pDVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  bool bVar7;
  
  BT_lines = 0;
  URaid_FXarray[0] = startFX;
  printf("%3d : ",0);
  uVar6 = (ulong)startFX->fnheader;
  if ((startFX->fnheader & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar6);
  }
  pDVar3 = Lisp_world;
  if (((ulong)startFX & 1) != 0) {
    printf("Misaligned pointer in LAddrFromNative %p\n",startFX);
  }
  printf("   0x%x : ",(ulong)((long)startFX - (long)Lisp_world) >> 1);
  print(*(uint *)(pDVar3 + uVar6 + 4) & 0xfffffff);
  putchar(10);
  iVar1 = BT_lines + 1;
  bVar7 = 0x1d < BT_lines;
  BT_lines = iVar1;
  if (bVar7) {
    printf("Press Return(to quit Esc and Ret):");
    BT_temp = getchar();
    fflush(_stdin);
    BT_lines = 0;
    if (BT_temp == 0x1b) goto LAB_0011661d;
  }
  uVar5 = 1;
  bVar7 = (*(uint *)(pDVar3 + uVar6 + 4) & 0xfffffff) == 0x4c;
  if (!bVar7) {
    DVar2 = startFX->alink;
    while (DVar2 != 0xb) {
      if (1999 < (int)uVar5) {
        printf("***There are more than %d stack frames.\n");
        puts(
            "If you want to continue, Uraid will smash its internal table for FX pointer. Do you accept?(Y or N)"
            );
        uVar4 = getchar();
        fflush(_stdin);
        if ((uVar4 & 0xffffffdf) != 0x59) goto LAB_001165f6;
        uVar5 = 0;
        memset(URaid_FXarray,0,8000);
      }
      startFX = get_nextFX(startFX);
      uVar6 = (ulong)startFX->fnheader;
      if ((startFX->fnheader & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar6);
      }
      pDVar3 = Lisp_world;
      URaid_FXarray[(int)uVar5] = startFX;
      printf("%3d : ",(ulong)uVar5);
      if (((ulong)startFX & 1) != 0) {
        printf("Misaligned pointer in LAddrFromNative %p\n",startFX);
      }
      printf("   0x%x : ",(ulong)((long)startFX - (long)Lisp_world) >> 1);
      print(*(uint *)(pDVar3 + uVar6 + 4) & 0xfffffff);
      putchar(10);
      iVar1 = BT_lines + 1;
      bVar7 = 0x1d < BT_lines;
      BT_lines = iVar1;
      if (bVar7) {
        printf("Press Return(to quit Esc and Ret):");
        BT_temp = getchar();
        fflush(_stdin);
        BT_lines = 0;
        if (BT_temp == 0x1b) goto LAB_0011661d;
      }
      uVar5 = uVar5 + 1;
      bVar7 = (*(uint *)(pDVar3 + uVar6 + 4) & 0xfffffff) == 0x4c;
      if (bVar7) goto LAB_001165f6;
      DVar2 = startFX->alink;
    }
    if (!bVar7) {
      puts(">>root frame for contextsw<<");
      putchar(10);
      iVar1 = BT_lines + 1;
      bVar7 = 0x1d < BT_lines;
      BT_lines = iVar1;
      if (bVar7) {
        printf("Press Return(to quit Esc and Ret):");
        BT_temp = getchar();
        fflush(_stdin);
        BT_lines = 0;
        if (BT_temp == 0x1b) {
LAB_0011661d:
          BT_lines = 0;
          longjmp((__jmp_buf_tag *)BT_jumpbuf,1);
        }
      }
    }
  }
LAB_001165f6:
  URaid_ArrMAXIndex = uVar5 - 1;
  URaid_currentFX = 0;
  return;
}

Assistant:

void bt1(FX *startFX) {
  FX *fx;
  struct fnhead *fnobj;
  FX *get_nextFX(FX * fx);
  int fnum = 0;
  BT_lines = 0;
  fx = startFX;
  URaid_FXarray[fnum] = fx;
  printf("%3d : ", fnum++);
#ifdef BIGVM
  fnobj = (struct fnhead *)NativeAligned4FromLAddr(fx->fnheader);
#else
  fnobj = (struct fnhead *)NativeAligned4FromLAddr(((int)fx->hi2fnheader << 16) | fx->lofnheader);
#endif /* BIGVM */
  printf("   0x%x : ", LAddrFromNative(fx));
  print(fnobj->framename);
  putchar('\n');
  BT_morep;
  while ((fnobj->framename != ATOM_T) && (fx->alink != 11)) {
    if (fnum > URMAXFXNUM - 1) {
      /* Internal buf overflow, too many stack frames */
      printf("***There are more than %d stack frames.\n", URMAXFXNUM);
      printf(
          "If you want to continue, Uraid will smash its internal table for FX pointer. Do you "
          "accept?(Y or N)\n");
      {
        int c;
        c = getchar();
        fflush(stdin);
        if ((c == 'Y') || (c == 'y')) {
          fnum = 0;
          memset(URaid_FXarray, 0, URMAXFXNUM * 4);
        } else
          goto bt1_exit;
      }
    }

    fx = get_nextFX(fx);
#ifdef BIGVM
    fnobj = (struct fnhead *)NativeAligned4FromLAddr(fx->fnheader);
#else
    fnobj = (struct fnhead *)NativeAligned4FromLAddr(((int)fx->hi2fnheader << 16) | fx->lofnheader);
#endif /* BIGVM */
    URaid_FXarray[fnum] = fx;
    printf("%3d : ", fnum++);
    printf("   0x%x : ", LAddrFromNative(fx));
    print(fnobj->framename);
    putchar('\n');
    BT_morep;
  }
  if (fnobj->framename != ATOM_T) {
    printf(">>root frame for contextsw<<\n");
    putchar('\n');
    BT_morep;
  }

bt1_exit:
  URaid_ArrMAXIndex = fnum - 1;
  URaid_currentFX = 0;
}